

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void Fixpp::details::
     FromRef<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
     ::FieldRefCast<Fixpp::FieldRef<Fixpp::TagT<142u,Fixpp::Type::String>>,void>::
     cast<Fixpp::Field<Fixpp::TagT<142u,Fixpp::Type::String>>>
               (FieldRef<Fixpp::TagT<142U,_Fixpp::Type::String>_> *src,
               Field<Fixpp::TagT<142U,_Fixpp::Type::String>_> *dst)

{
  Type local_38;
  Field<Fixpp::TagT<142U,_Fixpp::Type::String>_> *local_18;
  Field<Fixpp::TagT<142U,_Fixpp::Type::String>_> *dst_local;
  FieldRef<Fixpp::TagT<142U,_Fixpp::Type::String>_> *src_local;
  
  local_18 = dst;
  dst_local = (Field<Fixpp::TagT<142U,_Fixpp::Type::String>_> *)src;
  FieldRef<Fixpp::TagT<142u,Fixpp::Type::String>>::get_abi_cxx11_(&local_38,src);
  Field<Fixpp::TagT<142u,Fixpp::Type::String>>::set<std::__cxx11::string>
            ((Field<Fixpp::TagT<142u,Fixpp::Type::String>> *)dst,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void cast(const FieldRef& src, Field& dst)
                {
                    dst.set(src.get());
                }